

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::Matcher<unsigned_long_long>::Matcher
          (Matcher<unsigned_long_long> *this,unsigned_long_long value)

{
  linked_ptr<const_testing::MatcherInterface<unsigned_long_long>_> local_30;
  
  (this->super_MatcherBase<unsigned_long_long>).impl_.value_ =
       (MatcherInterface<unsigned_long_long> *)0x0;
  (this->super_MatcherBase<unsigned_long_long>).impl_.link_.next_ =
       &(this->super_MatcherBase<unsigned_long_long>).impl_.link_;
  (this->super_MatcherBase<unsigned_long_long>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001d6008;
  local_30.value_ = (MatcherInterface<unsigned_long_long> *)operator_new(0x10);
  ((local_30.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001d61f8;
  local_30.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)value;
  local_30.link_.next_ = &local_30.link_;
  internal::linked_ptr<const_testing::MatcherInterface<unsigned_long_long>_>::operator=
            (&(this->super_MatcherBase<unsigned_long_long>).impl_,&local_30);
  internal::linked_ptr<const_testing::MatcherInterface<unsigned_long_long>_>::~linked_ptr(&local_30)
  ;
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }